

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O1

void print_pixel(char *string,Pixel *pixel,png_uint_32 format)

{
  char *pcVar1;
  
  pcVar1 = format_names[format];
  switch(format & 3) {
  case 0:
    sprintf(string,"%s(%d)",pcVar1,(ulong)(uint)pixel->g);
    return;
  case 1:
    sprintf(string,"%s(%d,%d)",pcVar1,(ulong)(uint)pixel->g,(ulong)(uint)pixel->a);
    return;
  case 2:
    sprintf(string,"%s(%d,%d,%d)",pcVar1,(ulong)(uint)pixel->r,(ulong)(uint)pixel->g,
            (ulong)(uint)pixel->b);
    return;
  case 3:
    sprintf(string,"%s(%d,%d,%d,%d)",pcVar1,(ulong)(uint)pixel->r,(ulong)(uint)pixel->g,
            (ulong)(uint)pixel->b,
            CONCAT44((int)((ulong)((long)&switchD_0010dd1f::switchdataD_001310c0 +
                                  (long)(int)(&switchD_0010dd1f::switchdataD_001310c0)[format & 3])
                          >> 0x20),pixel->a));
    return;
  }
}

Assistant:

static void
print_pixel(char string[64], const Pixel *pixel, png_uint_32 format)
{
   switch (format & (PNG_FORMAT_FLAG_ALPHA|PNG_FORMAT_FLAG_COLOR))
   {
      case 0:
         sprintf(string, "%s(%d)", format_names[format], pixel->g);
         break;

      case PNG_FORMAT_FLAG_ALPHA:
         sprintf(string, "%s(%d,%d)", format_names[format], pixel->g,
            pixel->a);
         break;

      case PNG_FORMAT_FLAG_COLOR:
         sprintf(string, "%s(%d,%d,%d)", format_names[format],
            pixel->r, pixel->g, pixel->b);
         break;

      case PNG_FORMAT_FLAG_COLOR|PNG_FORMAT_FLAG_ALPHA:
         sprintf(string, "%s(%d,%d,%d,%d)", format_names[format],
            pixel->r, pixel->g, pixel->b, pixel->a);
         break;

      default:
         sprintf(string, "invalid-format");
         break;
   }
}